

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

JsonNode * jsonLookup(JsonParse *pParse,char *zPath,int *pApnd,sqlite3_context *pCtx)

{
  JsonNode *pJVar1;
  char *pcVar2;
  char *zErr;
  char *local_20;
  
  local_20 = (char *)0x0;
  if (zPath != (char *)0x0) {
    pcVar2 = zPath;
    if ((*zPath == '$') &&
       (pJVar1 = jsonLookupStep(pParse,0,zPath + 1,pApnd,&local_20), pcVar2 = local_20,
       local_20 == (char *)0x0)) {
      return pJVar1;
    }
    local_20 = pcVar2;
    pParse->nErr = pParse->nErr + '\x01';
    pcVar2 = sqlite3_mprintf("JSON path error near \'%q\'",local_20);
    if (pcVar2 == (char *)0x0) {
      sqlite3_result_error_nomem(pCtx);
    }
    else {
      pCtx->isError = 1;
      sqlite3VdbeMemSetStr(pCtx->pOut,pcVar2,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
      sqlite3_free(pcVar2);
    }
  }
  return (JsonNode *)0x0;
}

Assistant:

static JsonNode *jsonLookup(
  JsonParse *pParse,      /* The JSON to search */
  const char *zPath,      /* The path to search */
  int *pApnd,             /* Append nodes to complete path if not NULL */
  sqlite3_context *pCtx   /* Report errors here, if not NULL */
){
  const char *zErr = 0;
  JsonNode *pNode = 0;
  char *zMsg;

  if( zPath==0 ) return 0;
  if( zPath[0]!='$' ){
    zErr = zPath;
    goto lookup_err;
  }
  zPath++;
  pNode = jsonLookupStep(pParse, 0, zPath, pApnd, &zErr);
  if( zErr==0 ) return pNode;

lookup_err:
  pParse->nErr++;
  assert( zErr!=0 && pCtx!=0 );
  zMsg = jsonPathSyntaxError(zErr);
  if( zMsg ){
    sqlite3_result_error(pCtx, zMsg, -1);
    sqlite3_free(zMsg);
  }else{
    sqlite3_result_error_nomem(pCtx);
  }
  return 0;
}